

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * iutest::detail::ToHexString<signed_char>(string *__return_storage_ptr__,char value)

{
  char cVar1;
  allocator<char> local_31;
  ulong local_30;
  size_t i;
  undefined8 uStack_20;
  char buf [3];
  size_t kN;
  char value_local;
  
  uStack_20 = 2;
  memset((void *)((long)&i + 5),0,3);
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    cVar1 = ToHex((int)value >> (('\x01' - (char)local_30) * '\x04' & 0x1fU));
    *(char *)((long)&i + local_30 + 5) = cVar1;
  }
  i._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)((long)&i + 5),&local_31);
  std::allocator<char>::~allocator(&local_31);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}